

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[8],long&,char_const(&)[21]>
                   (string *__return_storage_ptr__,char (*a) [8],long *b,char (*args) [21])

{
  string *psVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_a8 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  size_type local_58;
  pointer local_50;
  string *local_48;
  size_t local_40;
  char (*local_38) [21];
  undefined8 local_30;
  
  local_70.first._M_len = strlen(*a);
  local_70.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70.first._M_str = *a;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_a8,*b);
  psVar1 = (string *)(local_a8 + 0x10);
  if ((string *)local_a8._0_8_ != (string *)0x0) {
    psVar1 = (string *)local_a8._0_8_;
  }
  local_50 = (psVar1->_M_dataplus)._M_p;
  psVar1 = (string *)local_a8;
  if ((string *)local_a8._0_8_ != (string *)0x0) {
    psVar1 = (string *)local_a8._0_8_;
  }
  local_58 = psVar1->_M_string_length;
  local_48 = (string *)local_a8._0_8_;
  local_40 = strlen(*args);
  local_30 = 0;
  views._M_len = 3;
  views._M_array = &local_70;
  local_38 = args;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}